

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.cpp
# Opt level: O2

void * MS5837Thread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  int local_a50;
  int local_a4c;
  double local_a48;
  double local_a38;
  double local_a30;
  MS5837DATA ms5837data;
  interval local_a00;
  CHRONO chrono_filter;
  interval local_9a0;
  interval local_988;
  CHRONO chrono_period;
  char szTemp [256];
  MS5837 ms5837;
  char szSaveFilePath [256];
  
  memset(&ms5837,0,0x6e8);
  StartChrono(&chrono_filter);
  StartChrono(&chrono_period);
  local_a50 = 0x32;
  local_a48 = 0.0;
  bVar2 = false;
  local_a4c = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)local_a50);
      if (bPauseMS5837 == 0) break;
      if (!bVar2) {
        puts("MS5837 paused.");
        DisconnectMS5837(&ms5837);
      }
      if (bExit != 0) goto LAB_00184644;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartMS5837 == 0) {
      if (bVar2) goto LAB_00184316;
      iVar6 = GetLatestDataMS5837(&ms5837,&ms5837data);
      if (iVar6 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = ms5837data.Pressure;
        dVar10 = GetTimeElapsedChronoQuick(&chrono_filter);
        if ((2.0 < dVar10) && (dVar10 = GetTimeElapsedChronoQuick(&chrono_filter), dVar10 <= 3.0)) {
          local_a48 = ms5837data.Pressure;
        }
        dVar11 = GetTimeElapsedChronoQuick(&chrono_filter);
        dVar10 = ms5837data.Pressure;
        if (3.0 < dVar11) {
          uVar9 = -(ulong)(ABS(ms5837data.Pressure - local_a48) < 0.05);
          dVar10 = (double)((ulong)ms5837data.Pressure & uVar9 | ~uVar9 & (ulong)local_a48);
          local_a48 = dVar10;
        }
        local_a30 = ((dVar10 - ms5837.PressureRef) * -100000.0) / (ms5837.WaterDensity * 9.80665);
        interval::interval(&local_a00,&local_a30);
        local_a38 = -z_pressure_acc;
        interval::interval(&local_9a0,&local_a38,&z_pressure_acc);
        operator+(&local_a00,&local_9a0);
        interval::operator=((interval *)&z_pressure,&local_988);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_00184627;
      }
      puts("Connection to a MS5837 lost.");
      DisconnectMS5837(&ms5837);
LAB_00184333:
      local_a4c = local_a4c + 1;
      if (ExitOnErrorCount <= local_a4c && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_00184644:
        bVar3 = true;
        goto LAB_00184647;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a MS5837.");
        DisconnectMS5837(&ms5837);
      }
      bRestartMS5837 = 0;
LAB_00184316:
      iVar5 = ConnectMS5837(&ms5837,"MS58370.txt");
      iVar6 = ms5837.threadperiod;
      if (iVar5 != 0) {
        mSleep(1000);
        goto LAB_00184333;
      }
      local_a50 = ms5837.threadperiod;
      ms5837data.pressure = 0.0;
      ms5837data.temperature = 0.0;
      ms5837data.depth = 0.0;
      ms5837data.altitude = 0.0;
      ms5837data.Pressure = 0.0;
      StopChronoQuick(&chrono_filter);
      StartChrono(&chrono_filter);
      if (ms5837.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)ms5837.pfSaveFile);
        ms5837.pfSaveFile = (FILE *)0x0;
      }
      if (ms5837.bSaveRawData == 0) {
LAB_00184627:
        bVar3 = false;
        bVar2 = true;
      }
      else {
        if (ms5837.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"ms5837",7);
        }
        else {
          sprintf(szTemp,"%.127s",ms5837.szCfgFilePath);
        }
        sVar7 = strlen(szTemp);
        iVar5 = (int)sVar7 + 1;
        uVar9 = sVar7 & 0xffffffff;
        do {
          if ((int)uVar9 < 1) goto LAB_0018447e;
          uVar1 = uVar9 - 1;
          iVar5 = iVar5 + -1;
          lVar4 = uVar9 - 1;
          uVar9 = uVar1;
        } while (szTemp[lVar4] != '.');
        if ((uVar1 != 0) && (iVar5 <= (int)sVar7)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
        }
LAB_0018447e:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar8 = strtimeex_fns();
        bVar3 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar8);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        ms5837.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
        bVar2 = true;
        local_a50 = iVar6;
        if ((FILE *)ms5837.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create MS5837 data file.");
          bVar3 = false;
          goto LAB_00184647;
        }
      }
    }
    if (bExit != 0) {
LAB_00184647:
      StopChronoQuick(&chrono_period);
      StopChronoQuick(&chrono_filter);
      if (ms5837.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)ms5837.pfSaveFile);
        ms5837.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectMS5837(&ms5837);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MS5837Thread(void* pParam)
{
	MS5837 ms5837;
	MS5837DATA ms5837data;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms5837, 0, sizeof(MS5837));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS5837) 
		{ 
			if (bConnected)
			{
				printf("MS5837 paused.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS5837) 
		{ 
			if (bConnected)
			{
				printf("Restarting a MS5837.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			bRestartMS5837 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS5837(&ms5837, "MS58370.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms5837.threadperiod;

				memset(&ms5837data, 0, sizeof(ms5837data));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms5837.pfSaveFile != NULL)
				{
					fclose(ms5837.pfSaveFile); 
					ms5837.pfSaveFile = NULL;
				}
				if ((ms5837.bSaveRawData)&&(ms5837.pfSaveFile == NULL)) 
				{
					if (strlen(ms5837.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms5837.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms5837");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms5837.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms5837.pfSaveFile == NULL) 
					{
						printf("Unable to create MS5837 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMS5837(&ms5837, &ms5837data) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = ms5837data.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = ms5837data.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(ms5837data.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = ms5837data.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = ms5837data.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms5837.PressureRef, ms5837.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MS5837 lost.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
		}

		//printf("MS5837Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms5837.pfSaveFile != NULL)
	{
		fclose(ms5837.pfSaveFile); 
		ms5837.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS5837(&ms5837);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}